

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int aux_type2size(uint8_t type)

{
  uint local_c;
  uint8_t type_local;
  
  switch(type) {
  case 'A':
  case 'C':
  case 'c':
    local_c = 1;
    break;
  case 'B':
  case 'H':
  case 'Z':
    local_c = (uint)type;
    break;
  default:
    local_c = 0;
    break;
  case 'I':
  case 'f':
  case 'i':
    local_c = 4;
    break;
  case 'S':
  case 's':
    local_c = 2;
    break;
  case 'd':
    local_c = 8;
  }
  return local_c;
}

Assistant:

static inline int aux_type2size(uint8_t type)
{
    switch (type) {
    case 'A': case 'c': case 'C':
        return 1;
    case 's': case 'S':
        return 2;
    case 'i': case 'I': case 'f':
        return 4;
    case 'd':
        return 8;
    case 'Z': case 'H': case 'B':
        return type;
    default:
        return 0;
    }
}